

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dom.hpp
# Opt level: O3

void __thiscall crawler::Node::Node(Node *this,string *str,shared_ptr<crawler::Node> *_parent)

{
  pointer pcVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  
  (this->children).super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->nodeType = Text;
  *(undefined1 **)
   &(this->nodeData).
    super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>._M_u =
       (undefined1 *)
       ((long)&(this->nodeData).
               super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
               super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
               super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
               super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
               super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>
       + 0x10);
  pcVar1 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->nodeData,pcVar1,pcVar1 + str->_M_string_length);
  *(__index_type *)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> +
   0x50) = '\x01';
  (this->parent).super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (_parent->super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (_parent->super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (_parent->super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->parent).super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->parent).super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var3;
  (_parent->super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  return;
}

Assistant:

explicit Node(const std::string &str, std::shared_ptr<Node> _parent)
      : nodeType(NodeType::Text), nodeData(str), parent(std::move(_parent)) {}